

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

int Gia_WinAddCiWithMaxDivisors(Gia_Man_t *p,Vec_Wec_t *vLevels)

{
  int iPivot;
  bool bVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  pVVar3 = p->vCis;
  if (pVVar3->nSize < 1) {
    iVar4 = -1;
  }
  else {
    iVar4 = -1;
    lVar7 = 0;
    iVar5 = -1;
    do {
      iPivot = pVVar3->pArray[lVar7];
      if (((long)iPivot < 0) || (p->nObjs <= iPivot)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iPivot == 0) break;
      if (p->nTravIdsAlloc <= iPivot) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (p->pTravIds[iPivot] != p->nTravIds) {
        iVar2 = Gia_WinTryAddingNode(p,iPivot,-1,vLevels,(Vec_Int_t *)0x0);
        iVar6 = iVar5;
        if (iVar5 <= iVar2) {
          iVar6 = iVar2;
        }
        bVar1 = iVar5 < iVar2;
        iVar5 = iVar6;
        if (bVar1) {
          iVar4 = iPivot;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar3 = p->vCis;
    } while (lVar7 < pVVar3->nSize);
  }
  if (iVar4 < 0) {
    __assert_fail("iMaxFan >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x28a,"int Gia_WinAddCiWithMaxDivisors(Gia_Man_t *, Vec_Wec_t *)");
  }
  return iVar4;
}

Assistant:

int Gia_WinAddCiWithMaxDivisors( Gia_Man_t * p, Vec_Wec_t * vLevels )
{
    int i, Id, nCurFan, nMaxFan = -1, iMaxFan = -1;
    Gia_ManForEachCiId( p, Id, i )
    {
        if ( Gia_ObjIsTravIdCurrentId( p, Id ) )
            continue;
        nCurFan = Gia_WinTryAddingNode( p, Id, -1, vLevels, NULL );
        if ( nMaxFan < nCurFan )
        {
            nMaxFan = nCurFan;
            iMaxFan = Id;
        }
    }
    assert( iMaxFan >= 0 );
    return iMaxFan;
}